

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O3

void func_stack(void)

{
  int one;
  int three;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMemory addresses on stack:",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n&one=",6);
  std::ostream::_M_insert<void_const*>(&std::cout);
  stack_two();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMemory addresses on stack called from func_stack:",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n&three=",8);
  std::ostream::_M_insert<void_const*>(&std::cout);
  stack_two();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  func_static();
  return;
}

Assistant:

void func_stack()
{
	int one = 10000;
	/* Please note that addresses for &one, &two and &three differ
	 * only because stack_two is called from stack_one and
	 * stack_three is called from stack_two.
	 * If we call all thee function from func_stack
	 * the result will be different.
	 */
	std::cout << "\nMemory addresses on stack:";
	std::cout << "\n&one=" << &one;
	stack_two();
	std::cout << std::endl;

	/*
	 * Here you can see that address of &three is different
	 * when stack_three is invoked from func_stack and stack_two
	 */
	std::cout << "\nMemory addresses on stack called from func_stack:";
	stack_three();
	stack_two();
	std::cout << std::endl;

	// Static storage does not move like stack does
	func_static();
}